

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_record.cc
# Opt level: O0

void __thiscall RecordField::~RecordField(RecordField *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  Field *unaff_retaddr;
  ID *this_00;
  
  *in_RDI = &PTR__RecordField_0017a6e8;
  pvVar1 = (void *)in_RDI[0x19];
  if (pvVar1 != (void *)0x0) {
    DataPtr::~DataPtr((DataPtr *)0x14639d);
    operator_delete(pvVar1,0x30);
  }
  pvVar1 = (void *)in_RDI[0x1a];
  if (pvVar1 != (void *)0x0) {
    DataPtr::~DataPtr((DataPtr *)0x1463cd);
    operator_delete(pvVar1,0x30);
  }
  if ((void *)in_RDI[0x1b] != (void *)0x0) {
    operator_delete__((void *)in_RDI[0x1b]);
  }
  this_00 = (ID *)in_RDI[0x1c];
  if (this_00 != (ID *)0x0) {
    operator_delete__(this_00);
  }
  pvVar1 = (void *)in_RDI[0x1d];
  if (pvVar1 != (void *)0x0) {
    ID::~ID(this_00);
    operator_delete(pvVar1,0x78);
  }
  Field::~Field(unaff_retaddr);
  return;
}

Assistant:

RecordField::~RecordField()
	{
	delete begin_of_field_dataptr;
	delete end_of_field_dataptr;
	delete[] field_size_expr;
	delete[] field_offset_expr;
	delete end_of_field_dataptr_var;
	}